

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

void rw::d3d9::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  Geometry *this;
  InstanceDataHeader *pIVar4;
  uint32 uVar5;
  uint16 *puVar6;
  uint32 j;
  ulong uVar7;
  uint *puVar8;
  uint32 i;
  uint uVar9;
  MeshHeader *pMVar10;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) == 0) {
    return;
  }
  uVar5 = MeshHeader::guessNumTriangles(this->meshHeader);
  this->numTriangles = uVar5;
  Geometry::allocateData(this);
  Geometry::allocateMeshes(this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
  pIVar4 = this->instData;
  puVar6 = d3d::lockIndices(*(void **)(pIVar4 + 4),0,0,0);
  puVar8 = *(uint **)(pIVar4 + 0x1a);
  pMVar10 = this->meshHeader + 1;
  for (uVar9 = 0; uVar9 < pIVar4[2].platform; uVar9 = uVar9 + 1) {
    uVar2 = puVar8[1];
    if (uVar2 == 0) {
      memcpy(*(void **)pMVar10,puVar6 + puVar8[10],(ulong)(*puVar8 * 2));
    }
    else {
      uVar3 = *puVar8;
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        *(uint16 *)(*(long *)pMVar10 + uVar7 * 2) = puVar6[puVar8[10] + (int)uVar7] + (short)uVar2;
      }
    }
    pMVar10 = (MeshHeader *)&pMVar10[1].totalIndices;
    puVar8 = puVar8 + 0xc;
  }
  d3d::unlockIndices(*(void **)(pIVar4 + 4));
  (**(code **)&rwpipe[1].super_Pipeline.platform)(this);
  Geometry::generateTriangles(this,(int8 *)0x0);
  pbVar1 = (byte *)((long)&this->flags + 3);
  *pbVar1 = *pbVar1 & 0xfe;
  freeInstanceData(this);
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_D3D9);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	InstanceData *inst = header->inst;
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(inst->minVert == 0)
			memcpy(mesh->indices, &indices[inst->startIndex], inst->numIndex*2);
		else
			for(uint32 j = 0; j < inst->numIndex; j++)
				mesh->indices[j] = indices[inst->startIndex+j] + inst->minVert;
		mesh++;
		inst++;
	}
	unlockIndices(header->indexBuffer);

	pipe->uninstanceCB(geo, header);
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}